

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_math_imul(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue JVar4;
  int b;
  int a;
  
  iVar1 = JS_ToInt32(ctx,&a,*argv);
  iVar3 = 6;
  if (iVar1 == 0) {
    iVar1 = JS_ToInt32(ctx,&b,argv[1]);
    if (iVar1 == 0) {
      JVar2._0_4_ = b * a;
      JVar2._4_4_ = 0;
      iVar3 = 0;
      goto LAB_0015a2db;
    }
  }
  JVar2.float64 = 0.0;
LAB_0015a2db:
  JVar4.tag = iVar3;
  JVar4.u.float64 = JVar2.float64;
  return JVar4;
}

Assistant:

static JSValue js_math_imul(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    int a, b;

    if (JS_ToInt32(ctx, &a, argv[0]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &b, argv[1]))
        return JS_EXCEPTION;
    /* purposely ignoring overflow */
    return JS_NewInt32(ctx, a * b);
}